

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_close(Curl_easy *data)

{
  uint *puVar1;
  curl_llist *list;
  
  if (data != (Curl_easy *)0x0) {
    Curl_expire_clear(data);
    if (data->multi != (Curl_multi *)0x0) {
      curl_multi_remove_handle(data->multi,data);
    }
    if (data->multi_easy != (Curl_multi *)0x0) {
      curl_multi_cleanup(data->multi_easy);
    }
    list = (data->state).timeoutlist;
    if (list != (curl_llist *)0x0) {
      Curl_llist_destroy(list,(void *)0x0);
      (data->state).timeoutlist = (curl_llist *)0x0;
    }
    data->magic = 0;
    if ((data->state).rangestringalloc == true) {
      (*Curl_cfree)((data->state).range);
    }
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
    (*Curl_cfree)((data->req).protop);
    (data->req).protop = (void *)0x0;
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    Curl_ssl_close_all(data);
    (*Curl_cfree)((data->state).first_host);
    (data->state).first_host = (char *)0x0;
    (*Curl_cfree)((data->state).scratch);
    (data->state).scratch = (char *)0x0;
    Curl_ssl_free_certinfo(data);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    if ((data->change).referer_alloc == true) {
      (*Curl_cfree)((data->change).referer);
      (data->change).referer_alloc = false;
    }
    (data->change).referer = (char *)0x0;
    if ((data->change).url_alloc == true) {
      (*Curl_cfree)((data->change).url);
      (data->change).url_alloc = false;
    }
    (data->change).url = (char *)0x0;
    (*Curl_cfree)((data->state).buffer);
    (data->state).buffer = (char *)0x0;
    (*Curl_cfree)((data->state).headerbuff);
    (data->state).headerbuff = (char *)0x0;
    Curl_flush_cookies(data,1);
    Curl_digest_cleanup(data);
    (*Curl_cfree)((data->info).contenttype);
    (data->info).contenttype = (char *)0x0;
    (*Curl_cfree)((data->info).wouldredirect);
    (data->info).wouldredirect = (char *)0x0;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
      puVar1 = &data->share->dirty;
      *puVar1 = *puVar1 - 1;
      Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
    }
    if ((data->set).wildcardmatch == true) {
      Curl_wildcard_dtor(&data->wildcard);
    }
    Curl_freeset(data);
    (*Curl_cfree)(data);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_close(struct Curl_easy *data)
{
  struct Curl_multi *m;

  if(!data)
    return CURLE_OK;

  Curl_expire_clear(data); /* shut off timers */

  m = data->multi;

  if(m)
    /* This handle is still part of a multi handle, take care of this first
       and detach this handle from there. */
    curl_multi_remove_handle(data->multi, data);

  if(data->multi_easy)
    /* when curl_easy_perform() is used, it creates its own multi handle to
       use and this is the one */
    curl_multi_cleanup(data->multi_easy);

  /* Destroy the timeout list that is held in the easy handle. It is
     /normally/ done by curl_multi_remove_handle() but this is "just in
     case" */
  if(data->state.timeoutlist) {
    Curl_llist_destroy(data->state.timeoutlist, NULL);
    data->state.timeoutlist = NULL;
  }

  data->magic = 0; /* force a clear AFTER the possibly enforced removal from
                      the multi handle, since that function uses the magic
                      field! */

  if(data->state.rangestringalloc)
    free(data->state.range);

  /* Free the pathbuffer */
  Curl_safefree(data->state.pathbuffer);
  data->state.path = NULL;

  /* freed here just in case DONE wasn't called */
  Curl_free_request_state(data);

  /* Close down all open SSL info and sessions */
  Curl_ssl_close_all(data);
  Curl_safefree(data->state.first_host);
  Curl_safefree(data->state.scratch);
  Curl_ssl_free_certinfo(data);

  /* Cleanup possible redirect junk */
  free(data->req.newurl);
  data->req.newurl = NULL;

  if(data->change.referer_alloc) {
    Curl_safefree(data->change.referer);
    data->change.referer_alloc = FALSE;
  }
  data->change.referer = NULL;

  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }
  data->change.url = NULL;

  Curl_safefree(data->state.buffer);
  Curl_safefree(data->state.headerbuff);

  Curl_flush_cookies(data, 1);

  Curl_digest_cleanup(data);

  Curl_safefree(data->info.contenttype);
  Curl_safefree(data->info.wouldredirect);

  /* this destroys the channel and we cannot use it anymore after this */
  Curl_resolver_cleanup(data->state.resolver);

  Curl_http2_cleanup_dependencies(data);
  Curl_convert_close(data);

  /* No longer a dirty share, if it exists */
  if(data->share) {
    Curl_share_lock(data, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE);
    data->share->dirty--;
    Curl_share_unlock(data, CURL_LOCK_DATA_SHARE);
  }

  if(data->set.wildcardmatch) {
    /* destruct wildcard structures if it is needed */
    struct WildcardData *wc = &data->wildcard;
    Curl_wildcard_dtor(wc);
  }

  Curl_freeset(data);
  free(data);
  return CURLE_OK;
}